

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

void Str_NtkBalanceMux(Gia_Man_t *pNew,Str_Ntk_t *p,Str_Obj_t *pObj,Vec_Int_t *vDelay,int nLutSize,
                      int nGroups,int nMuxes,int fRecursive,int fOptArea,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  Str_Obj_t *pSVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  
  if (0 < nGroups) {
    iVar10 = 0;
    do {
      iVar8 = Str_MuxRestructure(pNew,p,(int)((ulong)((long)pObj - (long)p->pObjs) >> 4),nMuxes,
                                 vDelay,nLutSize,fRecursive,fOptArea,fVerbose);
      if (iVar8 == -1) {
        iVar8 = nMuxes;
        if (0 < nMuxes) {
          do {
            iVar1 = pObj->iOffset;
            if ((long)iVar1 < -2) {
LAB_007ca2ce:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar2 = (p->vFanins).nSize;
            if (iVar2 <= (int)(iVar1 + 2U)) goto LAB_007ca2ce;
            piVar6 = (p->vFanins).pArray;
            uVar9 = piVar6[iVar1 + 2U];
            if ((int)uVar9 < 0) goto LAB_007ca2ed;
            iVar3 = p->nObjs;
            if (iVar3 <= (int)(uVar9 >> 1)) {
LAB_007ca32b:
              __assert_fail("i < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaStr.c"
                            ,0x52,"Str_Obj_t *Str_NtkObj(Str_Ntk_t *, int)");
            }
            pSVar7 = p->pObjs;
            if (pSVar7[uVar9 >> 1].iCopy < 0) {
LAB_007ca30c:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x132,"int Abc_LitNotCond(int, int)");
            }
            if ((iVar1 == -2) || (iVar2 <= (int)(iVar1 + 1U))) goto LAB_007ca2ce;
            uVar4 = piVar6[iVar1 + 1U];
            if ((int)uVar4 < 0) goto LAB_007ca2ed;
            if (iVar3 <= (int)(uVar4 >> 1)) goto LAB_007ca32b;
            if (pSVar7[uVar4 >> 1].iCopy < 0) goto LAB_007ca30c;
            if ((iVar1 < 0) || (iVar2 <= iVar1)) goto LAB_007ca2ce;
            uVar5 = piVar6[iVar1];
            if ((int)uVar5 < 0) {
LAB_007ca2ed:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            if (iVar3 <= (int)(uVar5 >> 1)) goto LAB_007ca32b;
            if (pSVar7[uVar5 >> 1].iCopy < 0) goto LAB_007ca30c;
            uVar9 = Gia_ManHashMuxReal(pNew,pSVar7[uVar9 >> 1].iCopy ^ uVar9 & 1,
                                       pSVar7[uVar4 >> 1].iCopy ^ uVar4 & 1,
                                       pSVar7[uVar5 >> 1].iCopy ^ uVar5 & 1);
            pObj->iCopy = uVar9;
            if ((int)uVar9 < 0) goto LAB_007ca2ed;
            Str_ObjDelay(pNew,uVar9 >> 1,nLutSize,vDelay);
            pObj = pObj + 1;
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
      }
      else {
        pObj[nMuxes + -1].iCopy = iVar8;
        pObj = pObj + (long)(nMuxes + -1) + 1;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != nGroups);
  }
  return;
}

Assistant:

void Str_NtkBalanceMux( Gia_Man_t * pNew, Str_Ntk_t * p, Str_Obj_t * pObj, Vec_Int_t * vDelay, int nLutSize, int nGroups, int nMuxes, int fRecursive, int fOptArea, int fVerbose )
{
    extern int Str_MuxRestructure( Gia_Man_t * pNew, Str_Ntk_t * pNtk, int iMux, int nMuxes, Vec_Int_t * vDelay, int nLutSize, int fRecursive, int fOptArea, int fVerbose );
    int n, m, iRes, fUseRestruct = 1;
    if ( fUseRestruct )
    {
        for ( n = 0; n < nGroups; n++ )
        {            
            iRes = Str_MuxRestructure( pNew, p, Str_ObjId(p, pObj), nMuxes, vDelay, nLutSize, fRecursive, fOptArea, fVerbose );
            if ( iRes == -1 )
            {
                for ( m = 0; m < nMuxes; m++, pObj++ )
                {
                    pObj->iCopy = Gia_ManHashMuxReal( pNew, Str_ObjFaninCopy(p, pObj, 2), Str_ObjFaninCopy(p, pObj, 1), Str_ObjFaninCopy(p, pObj, 0) );
                    Str_ObjDelay( pNew, Abc_Lit2Var(pObj->iCopy), nLutSize, vDelay );
                }
            }
            else
            {
                pObj += nMuxes - 1;
                pObj->iCopy = iRes;
                pObj++;
            }
        }
    }
    else
    {
        for ( n = 0; n < nGroups * nMuxes; n++, pObj++ )
        {
            pObj->iCopy = Gia_ManHashMuxReal( pNew, Str_ObjFaninCopy(p, pObj, 2), Str_ObjFaninCopy(p, pObj, 1), Str_ObjFaninCopy(p, pObj, 0) );
            Str_ObjDelay( pNew, Abc_Lit2Var(pObj->iCopy), nLutSize, vDelay );
        }
    }
}